

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImageAspect
          (CopiesAndBlittingTestInstance *this,VkImage image,PixelBufferAccess *dst,
          ImageParms *imageParms)

{
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  TextureFormat *format;
  VkImageType VVar1;
  VkResult VVar2;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar3;
  ulong __n;
  TextureFormat format_00;
  ConstPixelBufferAccess *src;
  undefined8 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  deUint32 queueFamilyIndex;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_1c8;
  deUint64 local_1a8;
  undefined8 local_1a0;
  ulong local_198;
  VkQueue local_190;
  undefined8 local_188;
  TextureFormat *local_180;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier imageBarrier;
  undefined8 local_e0;
  TextureFormat local_d8;
  VkImageAspectFlags local_d0;
  undefined8 local_cc;
  deUint32 local_c4;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_b4;
  VkImageType local_ac;
  ConstPixelBufferAccess local_a8;
  undefined1 local_80 [40];
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_190 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  pAVar3 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  src = &dst->super_ConstPixelBufferAccess;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_80,&dst->super_ConstPixelBufferAccess);
  imageBarrier.oldLayout = calculateSize((CopiesAndBlittingTestInstance *)local_80,src);
  __n = (ulong)imageBarrier.oldLayout;
  VVar1 = imageParms->imageType;
  if (VVar1 != VK_IMAGE_TYPE_2D) {
    VVar1 = (imageParms->extent).depth;
  }
  local_188._0_4_ = (imageParms->extent).width;
  local_188._4_4_ = (imageParms->extent).height;
  imageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier._16_8_ = (ulong)imageBarrier.dstAccessMask << 0x20;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.srcQueueFamilyIndex = 2;
  imageBarrier.dstQueueFamilyIndex = 0;
  imageBarrier.image.m_internal._0_4_ = 1;
  imageBarrier.subresourceRange._0_8_ = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_1c8,vk,device,
                     (VkBufferCreateInfo *)&imageBarrier,(VkAllocationCallbacks *)0x0);
  postImageBarrier._16_8_ = local_1c8.m_data.deleter.m_device;
  postImageBarrier._24_8_ = local_1c8.m_data.deleter.m_allocator;
  postImageBarrier._0_8_ = local_1c8.m_data.object.m_internal;
  postImageBarrier.pNext = local_1c8.m_data.deleter.m_deviceIface;
  local_1c8.m_data.object.m_internal = 0;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_180 = (TextureFormat *)dst;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)postImageBarrier._16_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)postImageBarrier._24_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       postImageBarrier._0_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)postImageBarrier.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_1c8);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&postImageBarrier,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar3->_vptr_Allocator[3])(&local_1c8,pAVar3,&postImageBarrier,1);
  local_1c8.m_data.object.m_internal = 0;
  data._8_4_ = in_stack_fffffffffffffdd0;
  data.ptr = (Allocation *)in_stack_fffffffffffffdc8;
  data._12_4_ = in_stack_fffffffffffffdd4;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data
            );
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1c8);
  VVar2 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,
                     buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                     ((bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (bufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset);
  format = local_180;
  ::vk::checkResult(VVar2,
                    "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x22f);
  memset((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
         ptr)->m_hostPtr,0,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,__n);
  format_00 = ::vk::mapVkFormat(imageParms->format);
  postImageBarrier.subresourceRange.aspectMask = getAspectFlags(format_00);
  imageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier.srcAccessMask = 0x1000;
  imageBarrier.dstAccessMask = 0x800;
  imageBarrier.oldLayout = imageParms->operationLayout;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  imageBarrier.srcQueueFamilyIndex = 0xffffffff;
  imageBarrier.dstQueueFamilyIndex = 0xffffffff;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  imageBarrier.subresourceRange.baseArrayLayer = 0;
  if (imageParms->imageType == VK_IMAGE_TYPE_2D) {
    postImageBarrier.subresourceRange.layerCount = (imageParms->extent).depth;
  }
  else {
    postImageBarrier.subresourceRange.layerCount = 1;
  }
  local_1c8.m_data.object.m_internal._0_4_ = 0x2c;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1c8.m_data.deleter.m_device = (VkDevice)0x200000001000;
  local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0xffffffffffffffff;
  local_1a8 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_1a0 = 0;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x800;
  postImageBarrier.dstAccessMask = 0x1000;
  postImageBarrier.newLayout = imageBarrier.oldLayout;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = 1;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  local_198 = __n;
  postImageBarrier.image.m_internal = image.m_internal;
  imageBarrier.image.m_internal = image.m_internal;
  imageBarrier.subresourceRange.aspectMask = postImageBarrier.subresourceRange.aspectMask;
  imageBarrier.subresourceRange.layerCount = postImageBarrier.subresourceRange.layerCount;
  local_d0 = getAspectFlags(*format);
  local_e0 = 0;
  local_d8 = format[1];
  local_cc = 0;
  if (imageParms->imageType == VK_IMAGE_TYPE_2D) {
    local_c4 = (imageParms->extent).depth;
  }
  else {
    local_c4 = 1;
  }
  local_c0 = 0;
  local_b8 = 0;
  local_b4 = local_188;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  local_ac = VVar1;
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x285);
  cmdBuffer = &this->m_cmdBuffer;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x1000,0,0,
             0,0,0,1,&imageBarrier);
  (*vk->_vptr_DeviceInterface[99])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,image.m_internal,6
             ,buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,1,
             &local_e0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x5000,0,0,
             0,1,&local_1c8,1,&postImageBarrier);
  VVar2 = (*vk->_vptr_DeviceInterface[0x4a])
                    (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x289);
  submitCommandsAndWait(this,vk,device,local_190,(VkCommandBuffer *)cmdBuffer);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,__n);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_a8,format,(IVec3 *)(format + 1),
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_hostPtr);
  tcu::copy((EVP_PKEY_CTX *)format,(EVP_PKEY_CTX *)&local_a8);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::readImageAspect (vk::VkImage					image,
													 const tcu::PixelBufferAccess&	dst,
													 const ImageParms&				imageParms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	Allocator&					allocator			= m_context.getDefaultAllocator();

	Move<VkBuffer>				buffer;
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const VkDeviceSize			pixelDataSize		= calculateSize(dst);
	const VkExtent3D			imageExtent			= getExtent3D(imageParms);

	// Create destination buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			pixelDataSize,								// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, device, &bufferParams);
		bufferAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, device, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

		deMemset(bufferAlloc->getHostPtr(), 0, static_cast<size_t>(pixelDataSize));
		flushMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	}

	// Barriers for copying image to buffer
	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(imageParms.format));
	const VkImageMemoryBarrier				imageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
		imageParms.operationLayout,					// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{											// VkImageSubresourceRange	subresourceRange;
			formatAspect,			// VkImageAspectFlags	aspectMask;
			0u,						// deUint32				baseMipLevel;
			1u,						// deUint32				mipLevels;
			0u,						// deUint32				baseArraySlice;
			getArraySize(imageParms)// deUint32				arraySize;
		}
	};

	const VkBufferMemoryBarrier				bufferBarrier			=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		pixelDataSize								// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			oldLayout;
		imageParms.operationLayout,					// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{
			formatAspect,								// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			1u,											// deUint32				mipLevels;
			0u,											// deUint32				baseArraySlice;
			getArraySize(imageParms)					// deUint32				arraySize;
		}											// VkImageSubresourceRange	subresourceRange;
	};

	// Copy image to buffer
	const VkImageAspectFlags	aspect			= getAspectFlags(dst.getFormat());
	const VkBufferImageCopy		copyRegion		=
	{
		0u,									// VkDeviceSize				bufferOffset;
		(deUint32)dst.getWidth(),			// deUint32					bufferRowLength;
		(deUint32)dst.getHeight(),			// deUint32					bufferImageHeight;
		{
			aspect,								// VkImageAspectFlags		aspect;
			0u,									// deUint32					mipLevel;
			0u,									// deUint32					baseArrayLayer;
			getArraySize(imageParms),			// deUint32					layerCount;
		},									// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },						// VkOffset3D				imageOffset;
		imageExtent							// VkExtent3D				imageExtent;
	};

	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
	vk.cmdCopyImageToBuffer(*m_cmdBuffer, image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *buffer, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT|VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read buffer data
	invalidateMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	tcu::copy(dst, tcu::ConstPixelBufferAccess(dst.getFormat(), dst.getSize(), bufferAlloc->getHostPtr()));
}